

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

void phosg::format_data(function<void_(const_void_*,_unsigned_long)> *write_data,iovec *iovs,
                       size_t num_iovs,uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,
                       uint64_t flags)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  size_t *psVar7;
  long lVar8;
  ulong uVar9;
  logic_error *this;
  byte bVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  code *pcVar14;
  double dVar15;
  void *pvVar16;
  uint uVar17;
  ulong uVar18;
  undefined *puVar19;
  iovec *piVar20;
  long lVar21;
  void *pvVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  uint8_t current_value;
  string field;
  RedBoldTerminalGuard g;
  uint8_t line_buf [16];
  string line;
  uint8_t prev_line_buf [16];
  string local_218;
  double local_1f8;
  double local_1f0;
  undefined1 local_1e8 [16];
  _Any_data local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Any_data local_1b0 [2];
  double local_188;
  uint local_17c;
  double *local_178;
  ulong local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  ulong local_160;
  double local_158;
  long lStack_150;
  double local_140;
  size_t local_138;
  ulong local_130;
  iovec *local_128;
  iovec *local_120;
  void *local_118;
  ulong local_110;
  ulong local_108;
  size_t local_100;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  uint64_t local_d0;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  double local_48 [3];
  
  if (num_iovs != 0) {
    psVar7 = &iovs->iov_len;
    lVar21 = 0;
    sVar12 = num_iovs;
    do {
      lVar21 = lVar21 + *psVar7;
      psVar7 = psVar7 + 2;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
    if (lVar21 != 0) {
      local_138 = num_prev_iovs;
      local_100 = num_iovs;
      if (num_prev_iovs != 0) {
        psVar7 = &prev_iovs->iov_len;
        lVar8 = 0;
        sVar12 = num_prev_iovs;
        do {
          lVar8 = lVar8 + *psVar7;
          psVar7 = psVar7 + 2;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
        local_128 = prev_iovs;
        local_120 = iovs;
        if (lVar8 != lVar21) {
LAB_0010b482:
          this = (logic_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    ((runtime_error *)this,"previous iovs given, but data size does not match");
          puVar19 = &::std::runtime_error::typeinfo;
          pcVar14 = ::std::runtime_error::~runtime_error;
LAB_0010b434:
          __cxa_throw(this,puVar19,pcVar14);
        }
      }
      local_110 = lVar21 + start_address;
      local_17c = 2;
      uVar17 = (uint)flags;
      if ((((((uVar17 >> 8 & 1) == 0) && (local_17c = 4, (uVar17 >> 9 & 1) == 0)) &&
           (local_17c = 8, (uVar17 >> 10 & 1) == 0)) &&
          ((local_17c = 0x10, (uVar17 >> 0xb & 1) == 0 && (local_110 < 0x100000001)))) &&
         (local_17c = 8, local_110 < 0x10001)) {
        local_17c = (uint)(0x100 < local_110) * 2 + 2;
      }
      local_158 = 0.0;
      lStack_150 = 0;
      if (num_prev_iovs == 0) {
        local_178 = &local_158;
      }
      else {
        local_178 = local_48;
        local_48[0] = 0.0;
        local_48[1] = 0.0;
      }
      uVar13 = start_address & 0xfffffffffffffff0;
      local_b0 = uVar13 - local_110;
      if (uVar13 < local_110) {
        bVar30 = (flags & 0x40) == 0;
        uVar28 = (ulong)bVar30;
        local_c8 = "%0*lX";
        if (bVar30) {
          local_c8 = "%0*lX |";
        }
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar28 * 2 + 1);
        local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar28 + 1);
        local_b8 = (ulong)((uint)start_address & 0xf);
        local_120 = (iovec *)&iovs->iov_len;
        local_128 = (iovec *)&prev_iovs->iov_len;
        local_c0 = start_address - uVar13;
        local_118 = (void *)0x0;
        uVar28 = 0;
        pvVar16 = (void *)0x0;
        uVar29 = 0;
        local_d0 = start_address;
        do {
          local_b0 = local_b0 + 0x10;
          local_130 = 0;
          if (0 < (long)local_c0) {
            local_130 = local_c0;
          }
          uVar27 = 0;
          if (0 < (long)local_b8) {
            uVar27 = local_b8;
          }
          lVar21 = 0;
          if (0 < local_b0) {
            lVar21 = local_b0;
          }
          local_170 = start_address - uVar13;
          if ((long)local_170 < 1) {
            local_170 = 0;
          }
          local_108 = uVar13 + 0x10;
          uVar26 = local_108 - local_110;
          if ((long)uVar26 < 1) {
            uVar26 = 0;
          }
          pvVar22 = local_118;
          if ((char)((char)local_170 + (char)uVar26) != '\x10') {
            uVar9 = (ulong)(0x10U - ((int)lVar21 + (int)uVar27) & 0xff);
            uVar18 = 0;
            do {
              piVar20 = local_120 + uVar29;
              while (piVar20->iov_base <= pvVar16) {
                uVar29 = uVar29 + 1;
                piVar20 = piVar20 + 1;
                pvVar16 = (void *)0x0;
                if (local_100 <= uVar29) {
                  this = (logic_error *)__cxa_allocate_exception(0x10);
                  ::std::logic_error::logic_error(this,"reads exceeded final iov");
                  goto LAB_0010b426;
                }
              }
              *(undefined1 *)((long)&local_158 + uVar18 + (local_170 & 0xff)) =
                   *(undefined1 *)(piVar20[-1].iov_len + (long)pvVar16);
              pvVar16 = (void *)((long)pvVar16 + 1);
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar9);
            pvVar22 = local_118;
            if (local_138 != 0) {
              uVar18 = 0;
              do {
                piVar20 = local_128 + uVar28;
                while (piVar20->iov_base <= pvVar22) {
                  uVar28 = uVar28 + 1;
                  piVar20 = piVar20 + 1;
                  pvVar22 = (void *)0x0;
                  if (local_138 <= uVar28) {
                    this = (logic_error *)__cxa_allocate_exception(0x10);
                    ::std::logic_error::logic_error(this,"reads exceeded final prev iov");
LAB_0010b426:
                    puVar19 = &::std::logic_error::typeinfo;
                    pcVar14 = ::std::logic_error::~logic_error;
                    goto LAB_0010b434;
                  }
                }
                *(undefined1 *)((long)local_48 + uVar18 + (local_170 & 0xff)) =
                     *(undefined1 *)(piVar20[-1].iov_len + (long)pvVar22);
                pvVar22 = (void *)((long)pvVar22 + 1);
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar9);
            }
          }
          local_118 = pvVar22;
          if ((((flags & 0x20) == 0) || (uVar13 <= start_address)) ||
             ((local_110 <= local_108 ||
              ((local_158 != 0.0 || lStack_150 != 0 || (*local_178 != 0.0 || local_178[1] != 0.0))))
             )) {
            string_printf_abi_cxx11_(&local_f8,local_c8,(ulong)local_17c);
            local_1b0[0]._M_unused._M_object = local_f8._M_dataplus._M_p;
            local_1d8._M_unused._M_object = (void *)local_f8._M_string_length;
            if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_0010b43c;
            (*write_data->_M_invoker)
                      ((_Any_data *)write_data,(void **)local_1b0,
                       (unsigned_long *)local_1d8._M_pod_data);
            dVar15 = (double)(uVar27 & 0xff);
            local_188 = (double)(local_170 & 0xff);
            dVar23 = dVar15;
            if (local_188 == 0.0) {
              dVar24 = 0.0;
            }
            else {
              do {
                local_1b0[0]._M_unused._M_object = "   ";
                local_1d8._M_unused._M_member_pointer = 3;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010b441;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                dVar23 = (double)((long)dVar23 - 1);
                dVar24 = dVar15;
              } while (dVar23 != 0.0);
            }
            local_160 = uVar26 & 0xff;
            local_1f0 = (double)(0x10 - local_160);
            local_140 = dVar15;
            bVar10 = (byte)flags;
            if ((ulong)dVar24 < (ulong)local_1f0) {
              do {
                bVar1 = *(byte *)((long)&local_158 + (long)dVar24);
                bVar2 = *(byte *)((long)local_178 + (long)dVar24);
                ::std::function<void_(const_void_*,_unsigned_long)>::function
                          ((function<void_(const_void_*,_unsigned_long)> *)&local_88,write_data);
                local_1f8 = (double)CONCAT44(local_1f8._4_4_,(uint)bVar1);
                RedBoldTerminalGuard::RedBoldTerminalGuard
                          ((RedBoldTerminalGuard *)local_1b0,
                           (function<void_(const_void_*,_unsigned_long)> *)&local_88,
                           (bool)(bVar2 != bVar1 & bVar10));
                dVar15 = local_140;
                if (local_78 != (code *)0x0) {
                  (*local_78)(&local_88,&local_88,__destroy_functor);
                }
                string_printf_abi_cxx11_((string *)&local_1d8," %02X",(ulong)local_1f8 & 0xffffffff)
                ;
                local_218._M_dataplus._M_p = (pointer)local_1d8._M_unused._0_8_;
                local_1e8._8_8_ = local_1d8._8_8_;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010b44b;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)&local_218,
                           (unsigned_long *)(local_1e8 + 8));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_unused._0_8_ != &local_1c8) {
                  operator_delete(local_1d8._M_unused._M_object,
                                  (ulong)(local_1c8._M_allocated_capacity + 1));
                }
                RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0);
                dVar24 = (double)((long)dVar24 + 1);
              } while ((ulong)dVar24 < (ulong)local_1f0);
            }
            if ((ulong)dVar24 < 0x10) {
              lVar21 = (long)dVar24 - 0x10;
              do {
                local_1b0[0]._M_unused._M_object = "   ";
                local_1d8._M_unused._M_member_pointer = 3;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010b441;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0);
            }
            if ((flags & 2) != 0) {
              local_1b0[0]._M_unused._M_object = " | ";
              local_1d8._M_unused._M_object = local_d8;
              if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
              goto LAB_0010b43c;
              (*write_data->_M_invoker)
                        ((_Any_data *)write_data,(void **)local_1b0,
                         (unsigned_long *)local_1d8._M_pod_data);
              dVar23 = dVar15;
              if (local_188 == 0.0) {
                dVar15 = 0.0;
              }
              else {
                do {
                  local_1b0[0]._M_unused._M_object = " ";
                  local_1d8._M_unused._M_member_pointer = 1;
                  if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_0010b446;
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  dVar23 = (double)((long)dVar23 - 1);
                } while (dVar23 != 0.0);
              }
              if ((ulong)dVar15 < (ulong)local_1f0) {
                do {
                  local_1e8[0] = *(undefined1 *)((long)&local_158 + (long)dVar15);
                  cVar3 = *(char *)((long)local_178 + (long)dVar15);
                  ::std::function<void_(const_void_*,_unsigned_long)>::function
                            ((function<void_(const_void_*,_unsigned_long)> *)&local_a8,write_data);
                  RedBoldTerminalGuard::RedBoldTerminalGuard
                            ((RedBoldTerminalGuard *)local_1b0,
                             (function<void_(const_void_*,_unsigned_long)> *)&local_a8,
                             (bool)(cVar3 != local_1e8[0] & bVar10));
                  if (local_98 != (code *)0x0) {
                    (*local_98)(&local_a8,&local_a8,__destroy_functor);
                  }
                  if ((byte)(local_1e8[0] + 0x81) < 0xa1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&local_68,write_data)
                    ;
                    InverseTerminalGuard::InverseTerminalGuard
                              ((InverseTerminalGuard *)&local_1d8,
                               (function<void_(const_void_*,_unsigned_long)> *)&local_68,
                               (bool)(bVar10 & 1));
                    if (local_58 != (code *)0x0) {
                      (*local_58)(&local_68,&local_68,__destroy_functor);
                    }
                    local_218._M_dataplus._M_p = " ";
                    local_1e8._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_0010b450;
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)&local_218,
                               (unsigned_long *)(local_1e8 + 8));
                    InverseTerminalGuard::~InverseTerminalGuard((InverseTerminalGuard *)&local_1d8);
                  }
                  else {
                    local_1d8._M_unused._M_object = local_1e8;
                    local_218._M_dataplus._M_p = (pointer)0x1;
                    if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_0010b455;
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)&local_1d8,
                               (unsigned_long *)&local_218);
                  }
                  RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0);
                  dVar15 = (double)((long)dVar15 + 1);
                } while ((ulong)dVar15 < (ulong)local_1f0);
              }
              if ((ulong)dVar15 < 0x10) {
                lVar21 = (long)dVar15 - 0x10;
                do {
                  local_1b0[0]._M_unused._M_object = " ";
                  local_1d8._M_unused._M_member_pointer = 1;
                  if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_0010b446;
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 0);
              }
            }
            uVar11 = (uint)local_130 & 0xff;
            local_130 = (ulong)uVar11;
            if ((flags & 4) != 0) {
              uVar13 = (ulong)(uVar11 + 3 >> 2);
              if ((flags & 0x10) == 0) {
                if ((uVar17 >> 0xc & 1) == 0) {
                  if ((uVar17 >> 0xd & 1) == 0) {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        uVar27 = 0;
                      }
                      else {
                        uVar27 = (ulong)(SUB84(local_188,0) + 3U >> 2);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar13 = uVar13 - 1;
                        } while (uVar13 != 0);
                      }
                      iVar6 = (int)local_160;
                      for (; uVar27 < 4 - (ulong)(iVar6 + 3U >> 2); uVar27 = uVar27 + 1) {
                        local_1f8 = (double)CONCAT44(local_1f8._4_4_,
                                                     *(undefined4 *)((long)&local_158 + uVar27 * 4))
                        ;
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,
                                                     *(undefined4 *)((long)local_178 + uVar27 * 4));
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0._0_4_ != local_1f8._0_4_ & bVar10));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f8._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b46e;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if (uVar27 < 4) {
                        lVar21 = uVar27 - 4;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != 0);
                      }
                      goto LAB_0010aaac;
                    }
                  }
                  else {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        uVar27 = 0;
                      }
                      else {
                        uVar27 = (ulong)(SUB84(local_188,0) + 3U >> 2);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar13 = uVar13 - 1;
                        } while (uVar13 != 0);
                      }
                      iVar6 = (int)local_160;
                      for (; uVar27 < 4 - (ulong)(iVar6 + 3U >> 2); uVar27 = uVar27 + 1) {
                        local_1f8 = (double)CONCAT44(local_1f8._4_4_,
                                                     *(undefined4 *)((long)&local_158 + uVar27 * 4))
                        ;
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,
                                                     *(undefined4 *)((long)local_178 + uVar27 * 4));
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0._0_4_ != local_1f8._0_4_ & bVar10));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f8._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b473;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if (uVar27 < 4) {
                        lVar21 = uVar27 - 4;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != 0);
                      }
                      goto LAB_0010aaac;
                    }
                  }
                }
                else {
                  local_1b0[0]._M_unused._M_object = " |";
                  local_1d8._M_unused._M_object = local_168;
                  if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)local_1b0,
                               (unsigned_long *)local_1d8._M_pod_data);
                    if ((char)local_170 == '\0') {
                      dVar15 = 0.0;
                    }
                    else {
                      dVar15 = (double)(ulong)(SUB84(local_188,0) + 3U >> 2);
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_1d8._M_unused._M_member_pointer = 0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b43c;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)local_1d8._M_pod_data);
                        uVar13 = uVar13 - 1;
                      } while (uVar13 != 0);
                    }
                    local_140 = (double)(4 - (ulong)((int)local_160 + 3U >> 2));
                    if ((ulong)dVar15 < (ulong)local_140) {
                      do {
                        uVar11 = *(uint *)((long)&local_158 + (long)dVar15 * 4);
                        uVar4 = *(uint *)((long)local_178 + (long)dVar15 * 4);
                        local_1f8 = dVar15;
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        fVar25 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                         (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,fVar25);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)((float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                                  (uVar4 & 0xff00) << 8 | uVar4 << 0x18) != fVar25 &
                                         bVar10));
                        dVar15 = local_1f8;
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f0._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b464;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                        dVar15 = (double)((long)dVar15 + 1);
                      } while ((ulong)dVar15 < (ulong)local_140);
                    }
                    if ((ulong)dVar15 < 4) {
                      lVar21 = (long)dVar15 - 4;
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_218._M_dataplus._M_p = (pointer)0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b43c;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)&local_218);
                        lVar21 = lVar21 + 1;
                      } while (lVar21 != 0);
                    }
                    goto LAB_0010aaac;
                  }
                }
              }
              else {
                local_1b0[0]._M_unused._M_object = " |";
                local_1d8._M_unused._M_object = local_168;
                if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  if ((char)local_170 == '\0') {
                    dVar15 = 0.0;
                  }
                  else {
                    dVar15 = (double)(ulong)(SUB84(local_188,0) + 3U >> 2);
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_1d8._M_unused._M_member_pointer = 0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b43c;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  local_140 = (double)(4 - (ulong)((int)local_160 + 3U >> 2));
                  if ((ulong)dVar15 < (ulong)local_140) {
                    do {
                      uVar11 = *(uint *)((long)&local_158 + (long)dVar15 * 4);
                      uVar4 = *(uint *)((long)local_178 + (long)dVar15 * 4);
                      local_1f8 = dVar15;
                      ::std::function<void_(const_void_*,_unsigned_long)>::function
                                ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 write_data);
                      fVar25 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                       (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
                      local_1f0 = (double)CONCAT44(local_1f0._4_4_,fVar25);
                      RedBoldTerminalGuard::RedBoldTerminalGuard
                                ((RedBoldTerminalGuard *)local_1b0,
                                 (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 (bool)((float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                                (uVar4 & 0xff00) << 8 | uVar4 << 0x18) != fVar25 &
                                       bVar10));
                      dVar15 = local_1f8;
                      if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                        (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                      }
                      string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f0._0_4_);
                      local_1e8._8_8_ = local_218._M_dataplus._M_p;
                      local_1e8._0_8_ = local_218._M_string_length;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b45a;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                 (unsigned_long *)local_1e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_dataplus._M_p != &local_218.field_2) {
                        operator_delete(local_218._M_dataplus._M_p,
                                        local_218.field_2._M_allocated_capacity + 1);
                      }
                      RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0)
                      ;
                      dVar15 = (double)((long)dVar15 + 1);
                    } while ((ulong)dVar15 < (ulong)local_140);
                  }
                  if ((ulong)dVar15 < 4) {
                    lVar21 = (long)dVar15 - 4;
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_218._M_dataplus._M_p = (pointer)0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b43c;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)&local_218);
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != 0);
                  }
                  goto LAB_0010aaac;
                }
              }
              goto LAB_0010b43c;
            }
LAB_0010aaac:
            if ((flags & 8) == 0) {
LAB_0010b33c:
              local_1b0[0]._M_unused._M_object = "\n";
              local_1d8._M_unused._M_member_pointer = 1;
              if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                start_address = local_d0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                  start_address = local_d0;
                }
                goto LAB_0010b39a;
              }
            }
            else {
              uVar13 = (ulong)((int)local_130 + 7U >> 3);
              if ((flags & 0x10) == 0) {
                if ((uVar17 >> 0xc & 1) == 0) {
                  if ((uVar17 >> 0xd & 1) == 0) {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        dVar15 = 0.0;
                      }
                      else {
                        local_188 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar13 = uVar13 - 1;
                          dVar15 = local_188;
                        } while (uVar13 != 0);
                      }
                      iVar6 = (int)local_160;
                      for (; (ulong)dVar15 < 2 - (ulong)(iVar6 + 7U >> 3);
                          dVar15 = (double)((long)dVar15 + 1)) {
                        local_1f8 = (&local_158)[(long)dVar15];
                        local_1f0 = local_178[(long)dVar15];
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0 != local_1f8 & bVar10));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b478;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if ((ulong)dVar15 < 2) {
                        bVar30 = dVar15 == 0.0;
                        do {
                          bVar5 = bVar30;
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          bVar30 = false;
                        } while (bVar5);
                      }
                      goto LAB_0010b33c;
                    }
                  }
                  else {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        dVar15 = 0.0;
                      }
                      else {
                        local_188 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar13 = uVar13 - 1;
                          dVar15 = local_188;
                        } while (uVar13 != 0);
                      }
                      iVar6 = (int)local_160;
                      for (; (ulong)dVar15 < 2 - (ulong)(iVar6 + 7U >> 3);
                          dVar15 = (double)((long)dVar15 + 1)) {
                        local_1f8 = (&local_158)[(long)dVar15];
                        local_1f0 = local_178[(long)dVar15];
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0 != local_1f8 & bVar10));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b47d;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if ((ulong)dVar15 < 2) {
                        bVar30 = dVar15 == 0.0;
                        do {
                          bVar5 = bVar30;
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0010b43c;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          bVar30 = false;
                        } while (bVar5);
                      }
                      goto LAB_0010b33c;
                    }
                  }
                }
                else {
                  local_1b0[0]._M_unused._M_object = " |";
                  local_1d8._M_unused._M_object = local_168;
                  if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)local_1b0,
                               (unsigned_long *)local_1d8._M_pod_data);
                    if ((char)local_170 == '\0') {
                      dVar15 = 0.0;
                    }
                    else {
                      dVar15 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_1d8._M_unused._M_member_pointer = 0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b43c;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)local_1d8._M_pod_data);
                        uVar13 = uVar13 - 1;
                      } while (uVar13 != 0);
                    }
                    local_1f0 = (double)(2 - (ulong)((int)local_160 + 7U >> 3));
                    if ((ulong)dVar15 < (ulong)local_1f0) {
                      do {
                        dVar23 = (&local_158)[(long)dVar15];
                        dVar24 = local_178[(long)dVar15];
                        local_188 = dVar15;
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        local_1f8 = (double)((ulong)dVar23 >> 0x38 |
                                             ((ulong)dVar23 & 0xff000000000000) >> 0x28 |
                                             ((ulong)dVar23 & 0xff0000000000) >> 0x18 |
                                             ((ulong)dVar23 & 0xff00000000) >> 8 |
                                             ((ulong)dVar23 & 0xff000000) << 8 |
                                             ((ulong)dVar23 & 0xff0000) << 0x18 |
                                             ((ulong)dVar23 & 0xff00) << 0x28 | (long)dVar23 << 0x38
                                            );
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)((double)((ulong)dVar24 >> 0x38 |
                                                   ((ulong)dVar24 & 0xff000000000000) >> 0x28 |
                                                   ((ulong)dVar24 & 0xff0000000000) >> 0x18 |
                                                   ((ulong)dVar24 & 0xff00000000) >> 8 |
                                                   ((ulong)dVar24 & 0xff000000) << 8 |
                                                   ((ulong)dVar24 & 0xff0000) << 0x18 |
                                                   ((ulong)dVar24 & 0xff00) << 0x28 |
                                                  (long)dVar24 << 0x38) != local_1f8 & bVar10));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b469;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                        dVar15 = (double)((long)local_188 + 1);
                      } while ((ulong)dVar15 < (ulong)local_1f0);
                    }
                    if ((ulong)dVar15 < 2) {
                      bVar30 = dVar15 == 0.0;
                      do {
                        bVar5 = bVar30;
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_218._M_dataplus._M_p = (pointer)0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0010b43c;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)&local_218);
                        bVar30 = false;
                      } while (bVar5);
                    }
                    goto LAB_0010b33c;
                  }
                }
              }
              else {
                local_1b0[0]._M_unused._M_object = " |";
                local_1d8._M_unused._M_object = local_168;
                if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  if ((char)local_170 == '\0') {
                    dVar15 = 0.0;
                  }
                  else {
                    dVar15 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_1d8._M_unused._M_member_pointer = 0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b43c;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  local_1f0 = (double)(2 - (ulong)((int)local_160 + 7U >> 3));
                  if ((ulong)dVar15 < (ulong)local_1f0) {
                    do {
                      dVar23 = (&local_158)[(long)dVar15];
                      dVar24 = local_178[(long)dVar15];
                      local_188 = dVar15;
                      ::std::function<void_(const_void_*,_unsigned_long)>::function
                                ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 write_data);
                      local_1f8 = (double)((ulong)dVar23 >> 0x38 |
                                           ((ulong)dVar23 & 0xff000000000000) >> 0x28 |
                                           ((ulong)dVar23 & 0xff0000000000) >> 0x18 |
                                           ((ulong)dVar23 & 0xff00000000) >> 8 |
                                           ((ulong)dVar23 & 0xff000000) << 8 |
                                           ((ulong)dVar23 & 0xff0000) << 0x18 |
                                           ((ulong)dVar23 & 0xff00) << 0x28 | (long)dVar23 << 0x38);
                      RedBoldTerminalGuard::RedBoldTerminalGuard
                                ((RedBoldTerminalGuard *)local_1b0,
                                 (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 (bool)((double)((ulong)dVar24 >> 0x38 |
                                                 ((ulong)dVar24 & 0xff000000000000) >> 0x28 |
                                                 ((ulong)dVar24 & 0xff0000000000) >> 0x18 |
                                                 ((ulong)dVar24 & 0xff00000000) >> 8 |
                                                 ((ulong)dVar24 & 0xff000000) << 8 |
                                                 ((ulong)dVar24 & 0xff0000) << 0x18 |
                                                 ((ulong)dVar24 & 0xff00) << 0x28 |
                                                (long)dVar24 << 0x38) != local_1f8 & bVar10));
                      if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                        (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                      }
                      string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                      local_1e8._8_8_ = local_218._M_dataplus._M_p;
                      local_1e8._0_8_ = local_218._M_string_length;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b45f;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                 (unsigned_long *)local_1e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_dataplus._M_p != &local_218.field_2) {
                        operator_delete(local_218._M_dataplus._M_p,
                                        local_218.field_2._M_allocated_capacity + 1);
                      }
                      RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0)
                      ;
                      dVar15 = (double)((long)local_188 + 1);
                    } while ((ulong)dVar15 < (ulong)local_1f0);
                  }
                  if ((ulong)dVar15 < 2) {
                    bVar30 = dVar15 == 0.0;
                    do {
                      bVar5 = bVar30;
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_218._M_dataplus._M_p = (pointer)0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0010b43c;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)&local_218);
                      bVar30 = false;
                    } while (bVar5);
                  }
                  goto LAB_0010b33c;
                }
              }
            }
LAB_0010b43c:
            ::std::__throw_bad_function_call();
LAB_0010b441:
            ::std::__throw_bad_function_call();
LAB_0010b446:
            ::std::__throw_bad_function_call();
LAB_0010b44b:
            ::std::__throw_bad_function_call();
LAB_0010b450:
            ::std::__throw_bad_function_call();
LAB_0010b455:
            ::std::__throw_bad_function_call();
LAB_0010b45a:
            ::std::__throw_bad_function_call();
LAB_0010b45f:
            ::std::__throw_bad_function_call();
LAB_0010b464:
            ::std::__throw_bad_function_call();
LAB_0010b469:
            ::std::__throw_bad_function_call();
LAB_0010b46e:
            ::std::__throw_bad_function_call();
LAB_0010b473:
            ::std::__throw_bad_function_call();
LAB_0010b478:
            ::std::__throw_bad_function_call();
LAB_0010b47d:
            ::std::__throw_bad_function_call();
            goto LAB_0010b482;
          }
LAB_0010b39a:
          local_b8 = local_b8 - 0x10;
          local_c0 = local_c0 - 0x10;
          uVar13 = local_108;
        } while (local_108 < local_110);
      }
    }
  }
  return;
}

Assistant:

void format_data(
    function<void(const void*, size_t)> write_data,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (num_iovs == 0) {
    return;
  }

  size_t total_size = 0;
  for (size_t x = 0; x < num_iovs; x++) {
    total_size += iovs[x].iov_len;
  }
  if (total_size == 0) {
    return;
  }

  if (num_prev_iovs) {
    size_t total_prev_size = 0;
    for (size_t x = 0; x < num_prev_iovs; x++) {
      total_prev_size += prev_iovs[x].iov_len;
    }
    if (total_prev_size != total_size) {
      throw runtime_error("previous iovs given, but data size does not match");
    }
  }

  uint64_t end_address = start_address + total_size;

  int width_digits;
  if (flags & PrintDataFlags::OFFSET_8_BITS) {
    width_digits = 2;
  } else if (flags & PrintDataFlags::OFFSET_16_BITS) {
    width_digits = 4;
  } else if (flags & PrintDataFlags::OFFSET_32_BITS) {
    width_digits = 8;
  } else if (flags & PrintDataFlags::OFFSET_64_BITS) {
    width_digits = 16;
  } else if (end_address > 0x100000000) {
    width_digits = 16;
  } else if (end_address > 0x10000) {
    width_digits = 8;
  } else if (end_address > 0x100) {
    width_digits = 4;
  } else {
    width_digits = 2;
  }

  bool use_color = flags & PrintDataFlags::USE_COLOR;
  bool print_ascii = flags & PrintDataFlags::PRINT_ASCII;
  bool print_float = flags & PrintDataFlags::PRINT_FLOAT;
  bool print_double = flags & PrintDataFlags::PRINT_DOUBLE;
  bool reverse_endian = flags & PrintDataFlags::REVERSE_ENDIAN_FLOATS;
  bool big_endian = flags & PrintDataFlags::BIG_ENDIAN_FLOATS;
  bool little_endian = flags & PrintDataFlags::LITTLE_ENDIAN_FLOATS;
  bool collapse_zero_lines = flags & PrintDataFlags::COLLAPSE_ZERO_LINES;
  bool skip_separator = flags & PrintDataFlags::SKIP_SEPARATOR;

  // Reserve space for the current/previous line data
  uint8_t line_buf[0x10];
  memset(line_buf, 0, sizeof(line_buf));

  uint8_t prev_line_buf[0x10];
  uint8_t* prev_line_data = prev_line_buf;
  if (num_prev_iovs) {
    memset(prev_line_buf, 0, sizeof(prev_line_buf));
  } else {
    prev_line_data = line_buf;
  }

  size_t current_iov_index = 0;
  size_t current_iov_bytes = 0;
  size_t prev_iov_index = 0;
  size_t prev_iov_bytes = 0;
  for (uint64_t line_start_address = start_address & (~0x0F);
       line_start_address < end_address;
       line_start_address += 0x10) {

    // Figure out the boundaries of the current line
    uint64_t line_end_address = line_start_address + 0x10;
    uint8_t line_invalid_start_bytes = max<int64_t>(start_address - line_start_address, 0);
    uint8_t line_invalid_end_bytes = max<int64_t>(line_end_address - end_address, 0);
    uint8_t line_bytes = 0x10 - line_invalid_end_bytes - line_invalid_start_bytes;

    auto print_fields_column = [&]<typename LoadedDataT, typename StoredDataT>(
                                   const char* field_format,
                                   const void* blank_format,
                                   size_t blank_format_len) -> void {
      write_data(" |", skip_separator ? 1 : 2);

      const auto* line_fields = reinterpret_cast<const StoredDataT*>(line_buf);
      const auto* prev_line_fields = reinterpret_cast<const StoredDataT*>(prev_line_data);
      uint8_t line_invalid_start_fields = (line_invalid_start_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);
      uint8_t line_invalid_end_fields = (line_invalid_end_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);

      constexpr size_t field_count = 0x10 / sizeof(StoredDataT);
      size_t x = 0;
      for (; x < line_invalid_start_fields; x++) {
        write_data(blank_format, blank_format_len);
      }
      for (; x < static_cast<size_t>(field_count - line_invalid_end_fields); x++) {
        LoadedDataT current_value = line_fields[x];
        LoadedDataT previous_value = prev_line_fields[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        string field = string_printf(field_format, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < field_count; x++) {
        write_data(blank_format, blank_format_len);
      }
    };

    // Read the current and previous data for this line
    for (size_t x = 0; x < line_bytes; x++) {
      while (current_iov_bytes >= iovs[current_iov_index].iov_len) {
        current_iov_bytes = 0;
        current_iov_index++;
        if (current_iov_index >= num_iovs) {
          throw logic_error("reads exceeded final iov");
        }
      }
      line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
          iovs[current_iov_index].iov_base)[current_iov_bytes];
      current_iov_bytes++;
    }
    if (num_prev_iovs) {
      for (size_t x = 0; x < line_bytes; x++) {
        while (prev_iov_bytes >= prev_iovs[prev_iov_index].iov_len) {
          prev_iov_bytes = 0;
          prev_iov_index++;
          if (prev_iov_index >= num_prev_iovs) {
            throw logic_error("reads exceeded final prev iov");
          }
        }
        prev_line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
            prev_iovs[prev_iov_index].iov_base)[prev_iov_bytes];
        prev_iov_bytes++;
      }
    }

    if (collapse_zero_lines && (line_start_address > start_address) && (line_end_address < end_address) &&
        !memcmp(line_buf, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16) &&
        !memcmp(prev_line_data, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16)) {
      continue;
    }

    string line = string_printf(skip_separator ? "%0*" PRIX64 : "%0*" PRIX64 " |",
        width_digits, line_start_address);
    write_data(line.data(), line.size());

    {
      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data("   ", 3);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g(write_data, use_color && (previous_value != current_value));
        string field = string_printf(" %02" PRIX8, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < 0x10; x++) {
        write_data("   ", 3);
      }
    }

    if (print_ascii) {
      write_data(" | ", skip_separator ? 1 : 3);

      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data(" ", 1);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        if ((current_value < 0x20) || (current_value >= 0x7F)) {
          InverseTerminalGuard g2(write_data, use_color);
          write_data(" ", 1);
        } else {
          write_data(&current_value, 1);
        }
      }
      for (; x < 0x10; x++) {
        write_data(" ", 1);
      }
    }

    if (print_float) {
      if (reverse_endian) {
        print_fields_column.operator()<float, re_float>(" %12.5g", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<float, be_float>(" %12.5g", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<float, le_float>(" %12.5g", "             ", 13);
      } else {
        print_fields_column.operator()<float, float>(" %12.5g", "             ", 13);
      }
    }
    if (print_double) {
      if (reverse_endian) {
        print_fields_column.operator()<double, re_double>(" %12.5lg", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<double, be_double>(" %12.5lg", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<double, le_double>(" %12.5lg", "             ", 13);
      } else {
        print_fields_column.operator()<double, double>(" %12.5lg", "             ", 13);
      }
    }

    write_data("\n", 1);
  }
}